

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function_relation.cpp
# Opt level: O0

void __thiscall
duckdb::TableFunctionRelation::TableFunctionRelation
          (TableFunctionRelation *this,shared_ptr<duckdb::RelationContextWrapper,_true> *context,
          string *name_p,vector<duckdb::Value,_true> *parameters_p,
          named_parameter_map_t *named_parameters,
          shared_ptr<duckdb::Relation,_true> *input_relation_p,bool auto_init)

{
  string *in_RDX;
  undefined8 *in_RDI;
  Relation *in_R8;
  shared_ptr<duckdb::RelationContextWrapper,_true> *in_R9;
  byte in_stack_00000008;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  *in_stack_ffffffffffffff28;
  TableFunctionRelation *this_00;
  string *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  RelationType type;
  allocator local_59;
  string local_58 [39];
  byte local_31;
  
  type = (RelationType)((ulong)in_stack_ffffffffffffff50 >> 0x38);
  local_31 = in_stack_00000008 & 1;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_58,anon_var_dwarf_3eb64fd + 9,&local_59);
  Relation::Relation(in_R8,in_R9,type,in_stack_ffffffffffffff48);
  ::std::__cxx11::string::~string(local_58);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
  *in_RDI = &PTR__TableFunctionRelation_035332b8;
  this_00 = (TableFunctionRelation *)(in_RDI + 0xd);
  ::std::__cxx11::string::string((string *)this_00,in_RDX);
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)this_00,
             (vector<duckdb::Value,_true> *)in_stack_ffffffffffffff28);
  ::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                   *)this_00,in_stack_ffffffffffffff28);
  vector<duckdb::ColumnDefinition,_true>::vector
            ((vector<duckdb::ColumnDefinition,_true> *)0x195e3b6);
  shared_ptr<duckdb::Relation,_true>::shared_ptr
            ((shared_ptr<duckdb::Relation,_true> *)this_00,
             (shared_ptr<duckdb::Relation,_true> *)in_stack_ffffffffffffff28);
  *(byte *)(in_RDI + 0x20) = local_31 & 1;
  InitializeColumns(this_00);
  return;
}

Assistant:

TableFunctionRelation::TableFunctionRelation(const shared_ptr<RelationContextWrapper> &context, string name_p,
                                             vector<Value> parameters_p, named_parameter_map_t named_parameters,
                                             shared_ptr<Relation> input_relation_p, bool auto_init)
    : Relation(context, RelationType::TABLE_FUNCTION_RELATION), name(std::move(name_p)),
      parameters(std::move(parameters_p)), named_parameters(std::move(named_parameters)),
      input_relation(std::move(input_relation_p)), auto_initialize(auto_init) {
	InitializeColumns();
}